

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O0

int BN_MONT_CTX_set(BN_MONT_CTX *mont,BIGNUM *mod,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  unsigned_long buf [2];
  BIGNUM tmod;
  BIGNUM *R;
  BIGNUM *Ri;
  BN_CTX *in_stack_00000050;
  int ret;
  BIGNUM *in_stack_00000058;
  BIGNUM *in_stack_00000060;
  BIGNUM *in_stack_00000068;
  unsigned_long local_70;
  ulong local_68;
  undefined8 local_60;
  BIGNUM local_50;
  BIGNUM *local_38;
  BIGNUM *local_30;
  int local_24;
  BN_CTX *local_20;
  BIGNUM *local_18;
  BN_MONT_CTX *local_10;
  int local_4;
  
  local_24 = 0;
  local_20 = (BN_CTX *)ctx;
  local_18 = mod;
  local_10 = mont;
  iVar1 = BN_is_zero((BIGNUM *)mod);
  if (iVar1 == 0) {
    BN_CTX_start((BN_CTX *)local_20);
    local_30 = (BIGNUM *)BN_CTX_get((BN_CTX *)local_20);
    if (local_30 != (BIGNUM *)0x0) {
      local_38 = (BIGNUM *)&local_10->RR;
      pBVar2 = BN_copy(&local_10->N,local_18);
      if (pBVar2 != (BIGNUM *)0x0) {
        (local_10->N).neg = 0;
        bn_init(&local_50);
        local_50.d = &local_68;
        local_50.dmax = 2;
        local_50.neg = 0;
        iVar1 = BN_num_bits(local_18);
        local_10->ri = (iVar1 + 0x3f) / 0x40 << 6;
        BN_zero_ex(local_38);
        iVar1 = BN_set_bit((BIGNUM *)local_38,0x40);
        if (iVar1 != 0) {
          local_68 = *local_18->d;
          local_60 = 0;
          local_50.top = (int)(local_68 != 0);
          iVar1 = BN_mod_inverse_Lehmer
                            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050
                            );
          if ((iVar1 != 0) &&
             (iVar1 = BN_lshift((BIGNUM *)local_30,(BIGNUM *)local_30,0x40), iVar1 != 0)) {
            iVar1 = BN_is_zero(local_30);
            if (iVar1 == 0) {
              iVar1 = BN_sub_word((BIGNUM *)local_30,1);
            }
            else {
              iVar1 = BN_set_word((BIGNUM *)local_30,0xffffffffffffffff);
            }
            if ((iVar1 != 0) &&
               (iVar1 = BN_div(local_30,(BIGNUM *)0x0,local_30,&local_50,local_20), iVar1 != 0)) {
              if (local_30->top < 1) {
                local_70 = 0;
              }
              else {
                local_70 = *local_30->d;
              }
              local_10->n0[0] = local_70;
              local_10->n0[1] = 0;
              BN_zero_ex((BIGNUM *)&local_10->RR);
              iVar1 = BN_set_bit(&local_10->RR,local_10->ri << 1);
              if ((iVar1 != 0) &&
                 (iVar1 = BN_div((BIGNUM *)0x0,(BIGNUM *)&local_10->RR,(BIGNUM *)&local_10->RR,
                                 (BIGNUM *)&local_10->N,local_20), iVar1 != 0)) {
                local_24 = 1;
              }
            }
          }
        }
      }
    }
    BN_CTX_end((BN_CTX *)local_20);
    local_4 = local_24;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BN_MONT_CTX_set(BN_MONT_CTX *mont, const BIGNUM *mod, BN_CTX *ctx)
{
    int ret = GML_ERROR;
    BIGNUM *Ri, *R;

    if (BN_is_zero(mod))
        return 0;

    BN_CTX_start(ctx);
    if ((Ri = BN_CTX_get(ctx)) == NULL)
        goto err;
    R = &(mont->RR);            /* grab RR as a temp */
    if (!BN_copy(&(mont->N), mod))
        goto err;               /* Set N */
    mont->N.neg = 0;

#ifdef MONT_WORD
    {
        BIGNUM tmod;
        BN_ULONG buf[2];

        bn_init(&tmod);
        tmod.d = buf;
        tmod.dmax = 2;
        tmod.neg = 0;

        mont->ri = (BN_num_bits(mod) + (BN_BITS2 - 1)) / BN_BITS2 * BN_BITS2;

# if (BN_BITS2<=32)
        /*
         * Only certain BN_BITS2<=32 platforms actually make use of n0[1],
         * and we could use the #else case (with a shorter R value) for the
         * others.  However, currently only the assembler files do know which
         * is which.
         */

        BN_zero(R);
        if (!(BN_set_bit(R, 2 * BN_BITS2)))
            goto err;

        tmod.top = 0;
        if ((buf[0] = mod->d[0]))
            tmod.top = 1;
        if ((buf[1] = mod->top > 1 ? mod->d[1] : 0))
            tmod.top = 2;

        if ((BN_mod_inverse(Ri, R, &tmod, ctx)) == NULL)
            goto err;
        if (!BN_lshift(Ri, Ri, 2 * BN_BITS2))
            goto err;           /* R*Ri */
        if (!BN_is_zero(Ri)) {
            if (!BN_sub_word(Ri, 1))
                goto err;
        } else {                /* if N mod word size == 1 */

            if (bn_expand(Ri, (int)sizeof(BN_ULONG) * 2) == NULL)
                goto err;
            /* Ri-- (mod double word size) */
            Ri->neg = 0;
            Ri->d[0] = BN_MASK2;
            Ri->d[1] = BN_MASK2;
            Ri->top = 2;
        }
        if (!BN_div(Ri, NULL, Ri, &tmod, ctx))
            goto err;
        /*
         * Ni = (R*Ri-1)/N, keep only couple of least significant words:
         */
        mont->n0[0] = (Ri->top > 0) ? Ri->d[0] : 0;
        mont->n0[1] = (Ri->top > 1) ? Ri->d[1] : 0;
# else
        BN_zero(R);
        if (!(BN_set_bit(R, BN_BITS2)))
            goto err;           /* R */

        buf[0] = mod->d[0];     /* tmod = N mod word size */
        buf[1] = 0;
        tmod.top = buf[0] != 0 ? 1 : 0;
        /* Ri = R^-1 mod N */
        if (!(BN_mod_inverse_Lehmer(Ri, R, &tmod, ctx)))
            goto err;
        if (!BN_lshift(Ri, Ri, BN_BITS2))
            goto err;           /* R*Ri */
        if (!BN_is_zero(Ri)) {
            if (!BN_sub_word(Ri, 1))
                goto err;
        } else {                /* if N mod word size == 1 */

            if (!BN_set_word(Ri, BN_MASK2))
                goto err;       /* Ri-- (mod word size) */
        }
        if (!BN_div(Ri, NULL, Ri, &tmod, ctx))
            goto err;
        /*
         * Ni = (R*Ri-1)/N, keep only least significant word:
         */
        mont->n0[0] = (Ri->top > 0) ? Ri->d[0] : 0;
        mont->n0[1] = 0;
# endif
    }
#else                           /* !MONT_WORD */
    {                           /* bignum version */
        mont->ri = BN_num_bits(&mont->N);
        BN_zero(R);
        if (!BN_set_bit(R, mont->ri))
            goto err;           /* R = 2^ri */
        /* Ri = R^-1 mod N */
        if ((BN_mod_inverse_Lehmer(Ri, R, &mont->N, ctx)) == NULL)
            goto err;
        if (!BN_lshift(Ri, Ri, mont->ri))
            goto err;           /* R*Ri */
        if (!BN_sub_word(Ri, 1))
            goto err;
        /*
         * Ni = (R*Ri-1) / N
         */
        if (!BN_div(&(mont->Ni), NULL, Ri, &mont->N, ctx))
            goto err;
    }
#endif

    /* setup RR for conversions */
    BN_zero(&(mont->RR));
    if (!BN_set_bit(&(mont->RR), mont->ri * 2))
        goto err;
    if (!BN_mod(&(mont->RR), &(mont->RR), &(mont->N), ctx))
        goto err;

    ret = 1;
 err:
    BN_CTX_end(ctx);
    return ret;
}